

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O3

int __thiscall
QDateTimeParser::findMonth
          (QDateTimeParser *this,QStringView str,int startMonth,int sectionIndex,int year,
          QString *usedMonth,int *used)

{
  int iVar1;
  SectionNode *pSVar2;
  int month;
  long in_FS_OFFSET;
  QLocale l;
  QString local_1a8;
  QLocale local_190;
  QVLABase<QString> local_188;
  QString local_170 [13];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if (pSVar2->type != MonthSection) {
    findMonth();
    iVar1 = -1;
    goto LAB_0040aea9;
  }
  iVar1 = pSVar2->count;
  local_190.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QDateTimeParser[6])(&local_190,this);
  memset(local_170,0xaa,0x138);
  local_188.super_QVLABaseBase.a = 0xd;
  local_188.super_QVLABaseBase.s = 0;
  local_188.super_QVLABaseBase.ptr = local_170;
  if (startMonth < 0) {
    QVLABase<QString>::reallocate_impl(&local_188,0xd,local_170,0,(ulong)(0xd - startMonth));
LAB_0040adce:
    month = startMonth;
    do {
      QCalendar::monthName(&local_1a8,&this->calendar,&local_190,month,year,(uint)(iVar1 == 3));
      QVLABase<QString>::emplace_back_impl<QString>(&local_188,0xd,local_170,&local_1a8);
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      month = month + 1;
    } while (month != 0xd);
  }
  else if ((uint)startMonth < 0xd) goto LAB_0040adce;
  iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188.super_QVLABaseBase.s,
                        (QString *)local_188.super_QVLABaseBase.ptr,(int *)usedMonth);
  if (iVar1 < 0) {
    startMonth = 0;
  }
  std::_Destroy_n_aux<false>::__destroy_n<QString*,long_long>
            ((QString *)local_188.super_QVLABaseBase.ptr,local_188.super_QVLABaseBase.s);
  if ((QString *)local_188.super_QVLABaseBase.ptr != local_170) {
    QtPrivate::sizedFree(local_188.super_QVLABaseBase.ptr,local_188.super_QVLABaseBase.a * 0x18);
  }
  iVar1 = startMonth + iVar1;
  QLocale::~QLocale(&local_190);
LAB_0040aea9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QDateTimeParser::findMonth(QStringView str, int startMonth, int sectionIndex,
                               int year, QString *usedMonth, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (sn.type != MonthSection) {
        qWarning("QDateTimeParser::findMonth Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    QLocale l = locale();
    ShortVector<QString> monthNames;
    monthNames.reserve(13 - startMonth);
    for (int month = startMonth; month <= 12; ++month)
        monthNames.append(calendar.monthName(l, month, year, type));

    const int index = findTextEntry(str, monthNames, usedMonth, used);
    return index < 0 ? index : index + startMonth;
}